

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<double,_3> * __thiscall
tcu::refract<double,3>
          (Vector<double,_3> *__return_storage_ptr__,tcu *this,Vector<double,_3> *i,
          Vector<double,_3> *n,double eta)

{
  double dVar1;
  double dVar2;
  double a;
  double dVar3;
  Vector<double,_3> local_68;
  Vector<double,_3> local_50;
  double local_38;
  double k;
  double cosAngle;
  double eta_local;
  Vector<double,_3> *n_local;
  Vector<double,_3> *i_local;
  
  cosAngle = eta;
  eta_local = (double)i;
  n_local = (Vector<double,_3> *)this;
  i_local = __return_storage_ptr__;
  k = dot<double,3>(i,(Vector<double,_3> *)this);
  local_38 = -(cosAngle * cosAngle) * (-k * k + 1.0) + 1.0;
  if (0.0 <= local_38) {
    operator*(&local_50,n_local,cosAngle);
    a = eta_local;
    dVar2 = cosAngle;
    dVar1 = k;
    dVar3 = ::sqrt(local_38);
    operator*(&local_68,(Vector<double,_3> *)a,dVar2 * dVar1 + dVar3);
    operator-(__return_storage_ptr__,&local_50,&local_68);
  }
  else {
    Vector<double,_3>::Vector(__return_storage_ptr__,0.0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}